

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O0

void __thiscall
HdlcAnalyzerResults::GenerateExportFile
          (HdlcAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  HdlcFcsType HVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  HdlcFrameType HVar5;
  ulonglong uVar6;
  ostream *poVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  char local_658 [8];
  char fcsStr [128];
  Frame local_5d0 [8];
  Frame fcsFrame;
  ulonglong local_5c0;
  char local_5b0;
  HdlcAnalyzerResults local_5a8;
  char local_588 [8];
  char infoByteStr [64];
  Frame infoFrame;
  ulonglong local_538;
  char local_528;
  HdlcAnalyzerResults local_520;
  byte local_4fa;
  allocator local_4f9;
  string local_4f8 [8];
  string sep_1;
  char local_4d8 [8];
  char controlStr [64];
  Frame controlFrame;
  U8 local_488;
  undefined7 uStack_487;
  char local_478;
  uint local_470;
  U32 i;
  bool isUFrame;
  HdlcAnalyzerResults local_440;
  byte local_41a;
  allocator local_419;
  string local_418 [8];
  string sep;
  char local_3f8 [8];
  char addressStr_1 [64];
  Frame local_3b0 [7];
  bool endOfAddress;
  Frame nextAddress;
  ulong local_3a0;
  long local_398;
  char local_390;
  HdlcAnalyzerResults local_388;
  char local_368 [8];
  char addressStr [64];
  Frame local_320 [40];
  char local_2f8 [8];
  char timeStr [64];
  ulonglong local_290;
  Frame firstAddressFrame;
  ulonglong local_280;
  char local_270;
  int local_260;
  uint uStack_25c;
  bool doAbortFrame;
  ulong uStack_258;
  U32 numberOfControlBytes;
  U64 frameNumber;
  U64 numFrames;
  char escapeStr [5];
  char *pcStack_240;
  U8 fcsBits;
  char *sepChar;
  U32 sampleRate;
  U64 triggerSample;
  ofstream fileStream;
  U32 param_3_local;
  DisplayBase display_base_local;
  char *file_local;
  HdlcAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&triggerSample,file,_S_out);
  uVar6 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  pcStack_240 = " ";
  numFrames._7_1_ = 0;
  HVar1 = this->mSettings->mHdlcFcs;
  if (HVar1 == HDLC_CRC8) {
    numFrames._7_1_ = 8;
  }
  else if (HVar1 == HDLC_CRC16) {
    numFrames._7_1_ = 0x10;
  }
  else if (HVar1 == HDLC_CRC32) {
    numFrames._7_1_ = 0x20;
  }
  poVar7 = std::operator<<((ostream *)&triggerSample,"Time[s],Address,Control,Information,FCS");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  AnalyzerHelpers::GetNumberString(0x7d,display_base,8,(char *)((long)&numFrames + 2),5);
  uVar8 = AnalyzerResults::GetNumFrames();
  uStack_258 = 0;
  uStack_25c = 0;
  switch(this->mSettings->mHdlcControl) {
  case HDLC_BASIC_CONTROL_FIELD:
    uStack_25c = 1;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
    uStack_25c = 2;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
    uStack_25c = 4;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
    uStack_25c = 8;
  }
  if (uVar8 != 0) {
LAB_001207ce:
    bVar2 = false;
    Frame::Frame((Frame *)&local_290);
    do {
      AnalyzerResults::GetFrame((ulonglong)(timeStr + 0x38));
      memcpy(&local_290,timeStr + 0x38,0x22);
      Frame::~Frame((Frame *)(timeStr + 0x38));
      if ((local_270 == '\x01') || (local_270 == '\x02')) {
        AnalyzerHelpers::GetTimeString(local_290,uVar6,uVar4,local_2f8,0x40);
        poVar7 = std::operator<<((ostream *)&triggerSample,local_2f8);
        std::operator<<(poVar7,",");
        if (this->mSettings->mHdlcAddr != HDLC_BASIC_ADDRESS_FIELD) {
          Frame::Frame(local_3b0,(Frame *)&local_290);
          goto LAB_00120a7b;
        }
        AnalyzerResults::GetFrame((ulonglong)local_320);
        memcpy(&local_290,local_320,0x22);
        Frame::~Frame(local_320);
        if (local_270 != '\x01') {
          poVar7 = std::operator<<((ostream *)&triggerSample,",");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          local_260 = 5;
          goto LAB_001215e6;
        }
        AnalyzerHelpers::GetNumberString(local_280,display_base,8,local_368,0x40);
        EscapeByteStr_abi_cxx11_(&local_388,(Frame *)this);
        poVar7 = std::operator<<((ostream *)&triggerSample,(string *)&local_388);
        poVar7 = std::operator<<(poVar7,local_368);
        std::operator<<(poVar7,",");
        std::__cxx11::string::~string((string *)&local_388);
        goto LAB_00120def;
      }
      uStack_258 = uStack_258 + 1;
    } while (uStack_258 < uVar8);
    AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uStack_258);
    local_260 = 1;
    goto LAB_001215e6;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
LAB_00121628:
  std::ofstream::~ofstream(&triggerSample);
  return;
  while( true ) {
    addressStr_1[0x3f] = (local_3a0 & 1) == 0;
    AnalyzerHelpers::GetNumberString(local_3a0,display_base,8,local_3f8,0x40);
    pcVar9 = pcStack_240;
    local_41a = 0;
    if (((addressStr_1[0x3f] & 1U) == 0) || (local_398 != 0)) {
      std::allocator<char>::allocator();
      local_41a = 1;
      std::__cxx11::string::string(local_418,pcVar9,&local_419);
    }
    else {
      std::__cxx11::string::string(local_418);
    }
    if ((local_41a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
    }
    poVar7 = std::operator<<((ostream *)&triggerSample,local_418);
    EscapeByteStr_abi_cxx11_(&local_440,(Frame *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_440);
    std::operator<<(poVar7,local_3f8);
    std::__cxx11::string::~string((string *)&local_440);
    if ((addressStr_1[0x3f] & 1U) == 0) {
      uStack_258 = uStack_258 + 1;
      if (uStack_258 < uVar8) {
        AnalyzerResults::GetFrame((ulonglong)&i);
        memcpy(local_3b0,&i,0x22);
        Frame::~Frame((Frame *)&i);
        local_260 = 0;
      }
      else {
        AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uStack_258);
        local_260 = 1;
      }
    }
    else {
      std::operator<<((ostream *)&triggerSample,",");
      local_260 = 8;
    }
    std::__cxx11::string::~string(local_418);
    if (local_260 != 0) break;
LAB_00120a7b:
    if (local_390 == '\a') {
      poVar7 = std::operator<<((ostream *)&triggerSample,",");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      bVar2 = true;
      goto LAB_00120db6;
    }
    if (local_390 != '\x02') {
      poVar7 = std::operator<<((ostream *)&triggerSample,",");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      goto LAB_00120db6;
    }
  }
  if (local_260 == 8) {
LAB_00120db6:
    local_260 = 0;
  }
  Frame::~Frame(local_3b0);
  if (local_260 == 0) {
LAB_00120def:
    if (bVar2) {
      local_260 = 5;
    }
    else {
      bVar10 = false;
      bVar2 = false;
      for (local_470 = 0; local_470 < uStack_25c; local_470 = local_470 + 1) {
        uStack_258 = uStack_258 + 1;
        if (uVar8 <= uStack_258) {
          AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uStack_258);
          local_260 = 1;
          goto LAB_001215e6;
        }
        AnalyzerResults::GetFrame((ulonglong)(controlStr + 0x38));
        if (local_478 == '\a') {
          bVar2 = true;
          poVar7 = std::operator<<((ostream *)&triggerSample,",");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          local_260 = 10;
        }
        else if ((local_478 == '\x03') || (local_478 == '\x04')) {
          if (local_470 == 0) {
            HVar5 = HdlcAnalyzer::GetFrameType(local_488);
            bVar10 = HVar5 == HDLC_U_FRAME;
          }
          AnalyzerHelpers::GetNumberString
                    (CONCAT71(uStack_487,local_488),display_base,8,local_4d8,0x40);
          pcVar9 = pcStack_240;
          local_4fa = 0;
          if ((bVar10) || (this->mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD)) {
            std::__cxx11::string::string(local_4f8);
          }
          else {
            std::allocator<char>::allocator();
            local_4fa = 1;
            std::__cxx11::string::string(local_4f8,pcVar9,&local_4f9);
          }
          if ((local_4fa & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
          }
          pcVar9 = (char *)std::__cxx11::string::c_str();
          poVar7 = std::operator<<((ostream *)&triggerSample,pcVar9);
          EscapeByteStr_abi_cxx11_(&local_520,(Frame *)this);
          poVar7 = std::operator<<(poVar7,(string *)&local_520);
          std::operator<<(poVar7,local_4d8);
          std::__cxx11::string::~string((string *)&local_520);
          if ((local_470 == 0) && (bVar10)) {
            local_260 = 10;
          }
          else {
            local_260 = 0;
          }
          std::__cxx11::string::~string(local_4f8);
        }
        else {
          poVar7 = std::operator<<((ostream *)&triggerSample,",");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          local_260 = 0xc;
        }
        Frame::~Frame((Frame *)(controlStr + 0x38));
        if ((local_260 != 0) && (local_260 == 10)) break;
      }
      if (bVar2) {
        local_260 = 5;
      }
      else {
        std::operator<<((ostream *)&triggerSample,",");
        uStack_258 = uStack_258 + 1;
        if (uStack_258 < uVar8) {
          bVar2 = false;
          do {
            AnalyzerResults::GetFrame((ulonglong)(infoByteStr + 0x38));
            if (local_528 == '\a') {
              bVar2 = true;
              poVar7 = std::operator<<((ostream *)&triggerSample,",");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              local_260 = 0xd;
            }
            else if (local_528 == '\0') {
              std::operator<<((ostream *)&triggerSample,",");
              local_260 = 0xd;
            }
            else if (local_528 == '\x05') {
              AnalyzerHelpers::GetNumberString(local_538,display_base,8,local_588,0x40);
              poVar7 = std::operator<<((ostream *)&triggerSample,pcStack_240);
              EscapeByteStr_abi_cxx11_(&local_5a8,(Frame *)this);
              poVar7 = std::operator<<(poVar7,(string *)&local_5a8);
              std::operator<<(poVar7,local_588);
              std::__cxx11::string::~string((string *)&local_5a8);
              uStack_258 = uStack_258 + 1;
              if (uStack_258 < uVar8) {
                local_260 = 0;
              }
              else {
                AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uStack_258);
                local_260 = 1;
              }
            }
            else {
              std::operator<<((ostream *)&triggerSample,",");
              local_260 = 0xd;
            }
            Frame::~Frame((Frame *)(infoByteStr + 0x38));
          } while (local_260 == 0);
          if (local_260 == 0xd) {
            if (bVar2) {
              local_260 = 5;
            }
            else {
              AnalyzerResults::GetFrame((ulonglong)local_5d0);
              if (local_5b0 == '\x06') {
                AnalyzerHelpers::GetNumberString
                          (local_5c0,display_base,(uint)numFrames._7_1_,local_658,0x80);
                poVar7 = std::operator<<((ostream *)&triggerSample,local_658);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar7 = std::operator<<((ostream *)&triggerSample,",");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              uStack_258 = uStack_258 + 1;
              if (uStack_258 < uVar8) {
                bVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                                  ((ulonglong)this,uStack_258);
                if ((bVar3 & 1) == 0) {
                  local_260 = 0;
                }
                else {
                  local_260 = 1;
                }
              }
              else {
                AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uStack_258);
                local_260 = 1;
              }
              Frame::~Frame(local_5d0);
            }
          }
        }
        else {
          AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uStack_258);
          local_260 = 1;
        }
      }
    }
  }
LAB_001215e6:
  Frame::~Frame((Frame *)&local_290);
  if ((local_260 == 0) || (local_260 == 5)) goto LAB_001207ce;
  goto LAB_00121628;
}

Assistant:

void HdlcAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    ofstream fileStream( file, ios::out );

    U64 triggerSample = mAnalyzer->GetTriggerSample();
    U32 sampleRate = mAnalyzer->GetSampleRate();

    const char* sepChar = " ";

    U8 fcsBits = 0;
    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
        fcsBits = 8;
        break;
    case HDLC_CRC16:
        fcsBits = 16;
        break;
    case HDLC_CRC32:
        fcsBits = 32;
        break;
    }

    fileStream << "Time[s],Address,Control,Information,FCS" << endl;

    char escapeStr[ 5 ];
    AnalyzerHelpers::GetNumberString( HDLC_ESCAPE_SEQ_VALUE, display_base, 8, escapeStr, 5 );

    U64 numFrames = GetNumFrames();
    U64 frameNumber = 0;

    U32 numberOfControlBytes = 0;
    switch( mSettings->mHdlcControl )
    {
    case HDLC_BASIC_CONTROL_FIELD:
        numberOfControlBytes = 1;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
        numberOfControlBytes = 2;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
        numberOfControlBytes = 4;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
        numberOfControlBytes = 8;
        break;
    }

    if( numFrames == 0 )
    {
        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
        return;
    }

    for( ;; )
    {
        bool doAbortFrame = false;
        // Re-sync to start reading HDLC frames from the Address Byte
        Frame firstAddressFrame;
        for( ;; )
        {
            firstAddressFrame = GetFrame( frameNumber );

            // Check for abort
            if( firstAddressFrame.mType == HDLC_FIELD_BASIC_ADDRESS ||
                firstAddressFrame.mType == HDLC_FIELD_EXTENDED_ADDRESS ) // It's and address frame
            {
                break;
            }
            else
            {
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
        }

        // 1)  Time [s]
        char timeStr[ 64 ];
        AnalyzerHelpers::GetTimeString( firstAddressFrame.mStartingSampleInclusive, triggerSample, sampleRate, timeStr, 64 );
        fileStream << timeStr << ",";

        // 2) Address Field
        if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
        {
            firstAddressFrame = GetFrame( frameNumber );
            if( firstAddressFrame.mType != HDLC_FIELD_BASIC_ADDRESS )
            {
                fileStream << "," << endl;
                continue;
            }

            char addressStr[ 64 ];
            AnalyzerHelpers::GetNumberString( firstAddressFrame.mData1, display_base, 8, addressStr, 64 );
            fileStream << EscapeByteStr( firstAddressFrame ) << addressStr << ",";
        }
        else // Check for extended address
        {
            Frame nextAddress = firstAddressFrame;
            for( ;; )
            {
                // Check for abort
                if( nextAddress.mType == HDLC_ABORT_SEQ )
                {
                    fileStream << "," << endl;
                    doAbortFrame = true;
                    break;
                }

                if( nextAddress.mType != HDLC_FIELD_EXTENDED_ADDRESS ) // ERROR
                {
                    fileStream << "," << endl;
                    break;
                }

                bool endOfAddress = ( ( nextAddress.mData1 & 0x01 ) == 0 );

                char addressStr[ 64 ];
                AnalyzerHelpers::GetNumberString( nextAddress.mData1, display_base, 8, addressStr, 64 );
                string sep = ( endOfAddress && nextAddress.mData2 == 0 ) ? string() : string( sepChar );
                fileStream << sep << EscapeByteStr( nextAddress ) << addressStr;

                if( endOfAddress ) // no more bytes of address?
                {
                    fileStream << ",";
                    break;
                }
                else
                {
                    frameNumber++;
                    if( frameNumber >= numFrames )
                    {
                        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                        return;
                    }
                    nextAddress = GetFrame( frameNumber );
                }
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 3) Control Field
        bool isUFrame = false;
        for( U32 i = 0; i < numberOfControlBytes; ++i )
        {
            frameNumber++;
            if( frameNumber >= numFrames )
            {
                UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                return;
            }

            Frame controlFrame = GetFrame( frameNumber );

            // Check for abort
            if( controlFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            if( !( controlFrame.mType == HDLC_FIELD_BASIC_CONTROL || controlFrame.mType == HDLC_FIELD_EXTENDED_CONTROL ) ) // ERROR
            {
                fileStream << "," << endl;
                continue;
            }

            if( i == 0 )
            {
                isUFrame = HdlcAnalyzer::GetFrameType( controlFrame.mData1 ) == HDLC_U_FRAME;
            }

            char controlStr[ 64 ];
            AnalyzerHelpers::GetNumberString( controlFrame.mData1, display_base, 8, controlStr, 64 );
            string sep = ( isUFrame || mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) ? string() : string( sepChar );
            fileStream << sep.c_str() << EscapeByteStr( controlFrame ) << controlStr;

            if( i == 0 && isUFrame )
            {
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        fileStream << ",";

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        // 5) Information Fields
        for( ;; )
        {
            Frame infoFrame = GetFrame( frameNumber );

            // Check for abort
            if( infoFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            // Check for flag
            if( infoFrame.mType == HDLC_FIELD_FLAG )
            {
                fileStream << ",";
                break;
            }

            // Check for info byte
            if( infoFrame.mType == HDLC_FIELD_INFORMATION ) // ERROR
            {
                char infoByteStr[ 64 ];
                AnalyzerHelpers::GetNumberString( infoFrame.mData1, display_base, 8, infoByteStr, 64 );
                fileStream << sepChar << EscapeByteStr( infoFrame ) << infoByteStr;
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
            else
            {
                fileStream << ",";
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 6) FCS Field
        Frame fcsFrame = GetFrame( frameNumber );
        if( fcsFrame.mType != HDLC_FIELD_FCS )
        {
            fileStream << "," << endl;
        }
        else // HDLC_FIELD_FCS Frame
        {
            char fcsStr[ 128 ];
            AnalyzerHelpers::GetNumberString( fcsFrame.mData1, display_base, fcsBits, fcsStr, 128 );
            fileStream << fcsStr << endl;
        }

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        if( UpdateExportProgressAndCheckForCancel( frameNumber, numFrames ) )
        {
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
}